

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O3

void __thiscall
cfd::core::KeyData::KeyData
          (KeyData *this,ExtPrivkey *ext_privkey,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *child_num_list,ByteData *finterprint)

{
  Privkey *this_00;
  void *pvVar1;
  ExtPubkey local_c0;
  
  Pubkey::Pubkey(&this->pubkey_);
  this_00 = &this->privkey_;
  Privkey::Privkey(this_00);
  Extkey::Extkey(&(this->extprivkey_).super_Extkey,&ext_privkey->super_Extkey);
  Extkey::Extkey(&(this->extpubkey_).super_Extkey);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->path_,child_num_list);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->fingerprint_).data_,&finterprint->data_);
  ExtPrivkey::GetExtPubkey(&local_c0,ext_privkey);
  (this->extpubkey_).super_Extkey.version_ = local_c0.super_Extkey.version_;
  ByteData::operator=(&(this->extpubkey_).super_Extkey.fingerprint_,
                      &local_c0.super_Extkey.fingerprint_);
  (this->extpubkey_).super_Extkey.depth_ = local_c0.super_Extkey.depth_;
  *(undefined3 *)&(this->extpubkey_).super_Extkey.field_0x21 = local_c0.super_Extkey._33_3_;
  (this->extpubkey_).super_Extkey.child_num_ = local_c0.super_Extkey.child_num_;
  ByteData256::operator=
            (&(this->extpubkey_).super_Extkey.chaincode_,&local_c0.super_Extkey.chaincode_);
  ByteData::operator=(&(this->extpubkey_).super_Extkey.privkey_.data_,
                      &local_c0.super_Extkey.privkey_.data_);
  (this->extpubkey_).super_Extkey.privkey_.is_compressed_ =
       local_c0.super_Extkey.privkey_.is_compressed_;
  *(undefined3 *)&(this->extpubkey_).super_Extkey.privkey_.field_0x19 =
       local_c0.super_Extkey.privkey_._25_3_;
  (this->extpubkey_).super_Extkey.privkey_.net_type_ = local_c0.super_Extkey.privkey_.net_type_;
  ByteData::operator=(&(this->extpubkey_).super_Extkey.pubkey_.data_,
                      &local_c0.super_Extkey.pubkey_.data_);
  ByteData256::operator=
            (&(this->extpubkey_).super_Extkey.tweak_sum_,&local_c0.super_Extkey.tweak_sum_);
  if (local_c0.super_Extkey.tweak_sum_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.super_Extkey.tweak_sum_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.super_Extkey.tweak_sum_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super_Extkey.tweak_sum_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c0.super_Extkey.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.super_Extkey.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.super_Extkey.pubkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super_Extkey.pubkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c0.super_Extkey.privkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.super_Extkey.privkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.super_Extkey.privkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super_Extkey.privkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c0.super_Extkey.chaincode_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.super_Extkey.chaincode_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.super_Extkey.chaincode_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super_Extkey.chaincode_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c0.super_Extkey.fingerprint_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.super_Extkey.fingerprint_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.super_Extkey.fingerprint_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super_Extkey.fingerprint_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c0,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &(ext_privkey->super_Extkey).privkey_);
  local_c0.super_Extkey.fingerprint_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = *(pointer *)&(ext_privkey->super_Extkey).privkey_.is_compressed_;
  ByteData::operator=(&this_00->data_,(ByteData *)&local_c0);
  *(pointer *)&(this->privkey_).is_compressed_ =
       local_c0.super_Extkey.fingerprint_.data_.
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  pvVar1 = (void *)CONCAT44(local_c0.super_Extkey._4_4_,local_c0.super_Extkey.version_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_c0.super_Extkey.fingerprint_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)pvVar1);
  }
  Privkey::GetPubkey((Pubkey *)&local_c0,this_00);
  ByteData::operator=((ByteData *)this,(ByteData *)&local_c0);
  pvVar1 = (void *)CONCAT44(local_c0.super_Extkey._4_4_,local_c0.super_Extkey.version_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_c0.super_Extkey.fingerprint_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)pvVar1);
  }
  return;
}

Assistant:

KeyData::KeyData(
    const ExtPrivkey& ext_privkey, const std::vector<uint32_t>& child_num_list,
    const ByteData& finterprint)
    : extprivkey_(ext_privkey),
      path_(child_num_list),
      fingerprint_(finterprint) {
  extpubkey_ = ext_privkey.GetExtPubkey();
  privkey_ = ext_privkey.GetPrivkey();
  pubkey_ = privkey_.GetPubkey();
}